

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

NULLCFuncPtr NULLC::FunctionRedirect(NULLCRef r,NULLCArray *arr)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  NULLCFuncPtr NVar8;
  
  if (arr == (NULLCArray *)0x0) {
    pcVar5 = "ERROR: null pointer access";
LAB_0011f883:
    nullcThrowError(pcVar5);
  }
  else {
    uVar1 = arr->len;
    if (uVar1 <= r.typeID) {
      pcVar5 = "ERROR: type index is out of bounds of redirection table";
      goto LAB_0011f883;
    }
    pcVar5 = arr->ptr;
    uVar6 = *(uint *)(pcVar5 + (ulong)r.typeID * 4);
    if (uVar6 != 0) goto LAB_0011f88f;
    uVar7 = 0;
    do {
      if (*(int *)(pcVar5 + uVar7 * 4) != 0) goto LAB_0011f8b2;
      uVar7 = uVar7 + 1;
    } while (uVar1 != (uint)uVar7);
    uVar7 = (ulong)uVar1;
LAB_0011f8b2:
    pcVar2 = nullcGetTypeName(r.typeID);
    if ((uint)uVar7 == uVar1) {
      nullcThrowError("ERROR: type \'%s\' doesn\'t implement method",pcVar2);
    }
    else {
      pcVar3 = nullcGetTypeName(r.typeID);
      pcVar4 = nullcGetFunctionName(*(uint *)(pcVar5 + (uVar7 & 0xffffffff) * 4));
      pcVar4 = strchr(pcVar4,0x3a);
      uVar1 = nullcGetFunctionType(*(uint *)(pcVar5 + (uVar7 & 0xffffffff) * 4));
      pcVar5 = nullcGetTypeName(uVar1);
      nullcThrowError("ERROR: type \'%s\' doesn\'t implement method \'%s%s\' of type \'%s\'",pcVar2,
                      pcVar3,pcVar4,pcVar5);
    }
  }
  uVar6 = 0;
  r.ptr = (char *)0x0;
LAB_0011f88f:
  NVar8.id = uVar6;
  NVar8.context = r.ptr;
  return NVar8;
}

Assistant:

NULLCFuncPtr NULLC::FunctionRedirect(NULLCRef r, NULLCArray* arr)
{
	NULLCFuncPtr ret = { 0, 0 };

	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}

	unsigned int *funcs = (unsigned int*)arr->ptr;
	if(r.typeID >= arr->len)
	{
		nullcThrowError("ERROR: type index is out of bounds of redirection table");
		return ret;
	}

	// If there is no implementation for a method
	if(!funcs[r.typeID])
	{
		// Find implemented function ID as a type reference
		unsigned int found = 0;
		for(; found < arr->len; found++)
		{
			if(funcs[found])
				break;
		}

		if(found == arr->len)
			nullcThrowError("ERROR: type '%s' doesn't implement method", nullcGetTypeName(r.typeID));
		else
			nullcThrowError("ERROR: type '%s' doesn't implement method '%s%s' of type '%s'", nullcGetTypeName(r.typeID), nullcGetTypeName(r.typeID), strchr(nullcGetFunctionName(funcs[found]), ':'), nullcGetTypeName(nullcGetFunctionType(funcs[found])));
		return ret;
	}

	ret.context = r.ptr;
	ret.id = funcs[r.typeID];

	return ret;
}